

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O2

Machine * getStructure(Machine *__return_storage_ptr__,Machine *m,Register r,Functor *f)

{
  int *this;
  undefined1 auVar1 [12];
  int iVar2;
  Machine *pMVar3;
  bool bVar4;
  Mode MVar5;
  mapped_type *pmVar6;
  Hix *__k;
  Addr a;
  Machine local_280;
  Machine local_210;
  Machine local_1a0;
  Functor local_130;
  Functor local_108;
  undefined1 local_e0 [8];
  Hcell hc;
  string local_a8 [104];
  Machine *local_40;
  key_type local_34;
  
  local_40 = __return_storage_ptr__;
  Machine::Machine(&local_280,m);
  auVar1._4_4_ = 0xffffffd6;
  auVar1._0_4_ = r.r;
  auVar1._8_4_ = 0;
  a = deref(&local_280,(Addr)(auVar1 << 0x20));
  Machine::~Machine(&local_280);
  Machine::Machine(&local_210,m);
  machineAtAddr((Hcell *)local_e0,&local_210,a);
  Machine::~Machine(&local_210);
  if (local_e0._0_4_ == Ref) {
    Hcell::ref((Hcell *)&hc.f_.arity,(Hix)((m->h).hix + 1));
    __k = &m->h;
    pmVar6 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,__k);
    Hcell::operator=(pmVar6,(Hcell *)&hc.f_.arity);
    std::__cxx11::string::~string(local_a8);
    Functor::Functor(&local_130,f);
    Hcell::functor((Hcell *)&hc.f_.arity,&local_130);
    local_34.hix = (m->h).hix + 1;
    pmVar6 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&local_34);
    Hcell::operator=(pmVar6,(Hcell *)&hc.f_.arity);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)&local_130);
    Machine::Machine(&local_1a0,m);
    bind((int)&hc + 0x28,(sockaddr *)&local_1a0,a.tag_);
    this = &hc.f_.arity;
    Machine::operator=(m,(Machine *)this);
    Machine::~Machine((Machine *)this);
    Machine::~Machine(&local_1a0);
    MVar5 = Write;
    iVar2 = 2;
  }
  else {
    if (local_e0._0_4_ != Str) {
      if (local_e0._0_4_ == Functor) {
        __assert_fail("false && \"cannot call getStructure on a functor\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                      ,0x132,"Machine getStructure(Machine, Register, Functor)");
      }
      goto LAB_00102c4d;
    }
    local_34.hix = (int)Hcell::hix((Hcell *)local_e0);
    pmVar6 = std::map<Hix,_Hcell,_std::less<Hix>,_std::allocator<std::pair<const_Hix,_Hcell>_>_>::
             operator[](&m->heap,&local_34);
    Functor::Functor(&local_108,f);
    Hcell::functor((Hcell *)&hc.f_.arity,&local_108);
    bVar4 = Hcell::operator==(pmVar6,(Hcell *)&hc.f_.arity);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)&local_108);
    if (!bVar4) goto LAB_00102c4d;
    __k = &m->s;
    MVar5 = Read;
    iVar2 = 1;
  }
  __k->hix = __k->hix + iVar2;
  m->mode = MVar5;
LAB_00102c4d:
  pMVar3 = local_40;
  Machine::Machine(local_40,m);
  std::__cxx11::string::~string((string *)&hc);
  return pMVar3;
}

Assistant:

Machine getStructure(Machine m, Register r, Functor f) {
    const Addr addr = deref(m, r);
    const Hcell hc = machineAtAddr(m, addr);

    switch (hc.tag) {
        case Htag::Ref:
            m.heap[m.h] = Hcell::ref(m.h + 1);
            m.heap[m.h + 1] = Hcell::functor(f);
            m = bind(m, addr, m.h);
            m.h += 2;
            m.mode = Mode::Write;
            break;
        case Htag::Str:
            if (m.heap[hc.hix()] == Hcell::functor(f)) {
                m.s += 1;
                m.mode = Mode::Read;
            }
            break;
        case Htag::Functor:
            assert(false && "cannot call getStructure on a functor");
    }
    return m;
}